

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O1

size_t __thiscall zmq::msg_t::size(msg_t *this)

{
  size_t sVar1;
  
  if (6 < (byte)((this->_u).base.type + 0x9b)) {
    size();
  }
  switch((this->_u).base.type) {
  case 'e':
    sVar1 = (size_t)(this->_u).base.unused[0x21];
    break;
  case 'f':
  case 'i':
    sVar1 = ((this->_u).lmsg.content)->size;
    break;
  default:
    size();
    sVar1 = 0;
    break;
  case 'h':
    sVar1 = (this->_u).cmsg.size;
  }
  return sVar1;
}

Assistant:

size_t zmq::msg_t::size () const
{
    //  Check the validity of the message.
    zmq_assert (check ());

    switch (_u.base.type) {
        case type_vsm:
            return _u.vsm.size;
        case type_lmsg:
            return _u.lmsg.content->size;
        case type_zclmsg:
            return _u.zclmsg.content->size;
        case type_cmsg:
            return _u.cmsg.size;
        default:
            zmq_assert (false);
            return 0;
    }
}